

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_t * ptls_new(ptls_context_t *ctx,int is_server)

{
  ptls_context_t *__dest;
  ptls_context_t *local_210 [61];
  ptls_context_t *local_28;
  ptls_t *tls;
  ptls_context_t *ppStack_18;
  int is_server_local;
  ptls_context_t *ctx_local;
  
  tls._4_4_ = is_server;
  ppStack_18 = ctx;
  if (ctx->get_time == (ptls_get_time_t *)0x0) {
    __assert_fail("ctx->get_time != NULL && \"please set ctx->get_time to `&ptls_get_time`; see #92\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/windrunner414[P]quicly/deps/picotls/lib/picotls.c"
                  ,0xd71,"ptls_t *ptls_new(ptls_context_t *, int)");
  }
  local_28 = (ptls_context_t *)malloc(0x1e8);
  if (local_28 == (ptls_context_t *)0x0) {
    ctx_local = (ptls_context_t *)0x0;
  }
  else {
    update_open_count(ppStack_18,1);
    __dest = local_28;
    memset(local_210,0,0x1e8);
    local_210[0] = ppStack_18;
    memcpy(__dest,local_210,0x1e8);
    *(byte *)&local_28[2].cipher_suites =
         *(byte *)&local_28[2].cipher_suites & 0xfe | (byte)tls._4_4_ & 1;
    *(byte *)&local_28[2].cipher_suites =
         *(byte *)&local_28[2].cipher_suites & 0xfb | ((byte)ppStack_18->field_0x60 >> 2 & 1) << 2;
    if (tls._4_4_ == 0) {
      *(undefined4 *)&local_28->get_time = 0;
      (**(code **)local_28->random_bytes)(&local_28[1].decompress_certificate,0x20);
      (**(code **)local_28->random_bytes)(&local_28[2].on_client_hello,0x20);
    }
    else {
      *(undefined4 *)&local_28->get_time = 8;
      *(undefined4 *)&local_28[2].save_ticket = 0xffffffff;
    }
    ctx_local = local_28;
  }
  return (ptls_t *)ctx_local;
}

Assistant:

ptls_t *ptls_new(ptls_context_t *ctx, int is_server)
{
    ptls_t *tls;

    assert(ctx->get_time != NULL && "please set ctx->get_time to `&ptls_get_time`; see #92");

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    update_open_count(ctx, 1);
    *tls = (ptls_t){ctx};
    tls->is_server = is_server;
    tls->send_change_cipher_spec = ctx->send_change_cipher_spec;
    if (!is_server) {
        tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
        tls->ctx->random_bytes(tls->client_random, sizeof(tls->client_random));
        tls->ctx->random_bytes(tls->client.legacy_session_id, sizeof(tls->client.legacy_session_id));
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
        tls->server.early_data_skipped_bytes = UINT32_MAX;
    }

    return tls;
}